

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitAlgorithms.cpp
# Opt level: O0

void __thiscall
Corrade::Utility::copyMasked
          (Utility *this,StridedArrayView2D<const_char> *src,BitArrayView srcMask,
          StridedArrayView2D<char> *dst)

{
  bool bVar1;
  type pSVar2;
  unsigned_long uVar3;
  size_t sVar4;
  ostream *poVar5;
  Debug *pDVar6;
  type pSVar7;
  long lVar8;
  long lVar9;
  size_t local_170;
  size_t i;
  char *dstPtr;
  char *srcPtr;
  ptrdiff_t dstStride;
  ptrdiff_t srcStride;
  Error local_140;
  Flags local_111;
  Error local_110;
  Flags local_e1;
  Error local_e0;
  unsigned_long local_b8;
  size_t dstTypeSize;
  size_t srcTypeSize;
  Error local_a0;
  size_t local_78;
  size_t srcMaskCount;
  Flags local_59;
  Error local_58;
  unsigned_long local_30;
  size_t srcSize;
  StridedArrayView2D<char> *dst_local;
  StridedArrayView2D<const_char> *src_local;
  BitArrayView srcMask_local;
  
  srcSize = srcMask._sizeOffset;
  srcMask_local._data = srcMask._data;
  dst_local = (StridedArrayView2D<char> *)this;
  src_local = src;
  pSVar2 = Containers::StridedArrayView<2U,_const_char>::size
                     ((StridedArrayView<2U,_const_char> *)this);
  uVar3 = Containers::StridedDimensions<2U,_unsigned_long>::operator[](pSVar2,0);
  local_30 = uVar3;
  sVar4 = Containers::BasicBitArrayView<const_char>::size
                    ((BasicBitArrayView<const_char> *)&src_local);
  if (uVar3 != sVar4) {
    poVar5 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
    Error::Error(&local_58,poVar5,local_59);
    pDVar6 = Debug::operator<<(&local_58.super_Debug,
                               "Utility::copyMasked(): expected source mask size to be");
    pDVar6 = Debug::operator<<(pDVar6,local_30);
    pDVar6 = Debug::operator<<(pDVar6,"but got");
    sVar4 = Containers::BasicBitArrayView<const_char>::size
                      ((BasicBitArrayView<const_char> *)&src_local);
    Debug::operator<<(pDVar6,sVar4);
    Error::~Error(&local_58);
    abort();
  }
  sVar4 = Containers::BasicBitArrayView<const_char>::count
                    ((BasicBitArrayView<const_char> *)&src_local);
  local_78 = sVar4;
  pSVar2 = Containers::StridedArrayView<2U,_char>::size((StridedArrayView<2U,_char> *)srcSize);
  uVar3 = Containers::StridedDimensions<2U,_unsigned_long>::operator[](pSVar2,0);
  if (sVar4 != uVar3) {
    poVar5 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> *)
               ((long)&srcTypeSize + 7));
    Error::Error(&local_a0,poVar5,srcTypeSize._7_1_);
    pDVar6 = Debug::operator<<(&local_a0.super_Debug,"Utility::copyMasked(): expected");
    pDVar6 = Debug::operator<<(pDVar6,local_78);
    pDVar6 = Debug::operator<<(pDVar6,"destination items but got");
    pSVar2 = Containers::StridedArrayView<2U,_char>::size((StridedArrayView<2U,_char> *)srcSize);
    uVar3 = Containers::StridedDimensions<2U,_unsigned_long>::operator[](pSVar2,0);
    Debug::operator<<(pDVar6,uVar3);
    Error::~Error(&local_a0);
    abort();
  }
  pSVar2 = Containers::StridedArrayView<2U,_const_char>::size
                     ((StridedArrayView<2U,_const_char> *)dst_local);
  dstTypeSize = Containers::StridedDimensions<2U,_unsigned_long>::operator[](pSVar2,1);
  pSVar2 = Containers::StridedArrayView<2U,_char>::size((StridedArrayView<2U,_char> *)srcSize);
  local_b8 = Containers::StridedDimensions<2U,_unsigned_long>::operator[](pSVar2,1);
  if (dstTypeSize != local_b8) {
    poVar5 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_e1);
    Error::Error(&local_e0,poVar5,local_e1);
    pDVar6 = Debug::operator<<(&local_e0.super_Debug,
                               "Utility::copyMasked(): expected second destination dimension size to be"
                              );
    pDVar6 = Debug::operator<<(pDVar6,dstTypeSize);
    pDVar6 = Debug::operator<<(pDVar6,"but got");
    Debug::operator<<(pDVar6,local_b8);
    Error::~Error(&local_e0);
    abort();
  }
  bVar1 = Containers::StridedArrayView<2u,char_const>::isContiguous<1u>
                    ((StridedArrayView<2u,char_const> *)dst_local);
  if (bVar1) {
    bVar1 = Containers::StridedArrayView<2u,char>::isContiguous<1u>
                      ((StridedArrayView<2u,char> *)srcSize);
    if (bVar1) {
      pSVar7 = Containers::StridedArrayView<2U,_const_char>::stride
                         ((StridedArrayView<2U,_const_char> *)dst_local);
      lVar8 = Containers::StridedDimensions<2U,_long>::operator[](pSVar7,0);
      pSVar7 = Containers::StridedArrayView<2U,_char>::stride((StridedArrayView<2U,_char> *)srcSize)
      ;
      lVar9 = Containers::StridedDimensions<2U,_long>::operator[](pSVar7,0);
      dstPtr = (char *)Containers::StridedArrayView<2U,_const_char>::data
                                 ((StridedArrayView<2U,_const_char> *)dst_local);
      i = (size_t)Containers::StridedArrayView<2U,_char>::data
                            ((StridedArrayView<2U,_char> *)srcSize);
      for (local_170 = 0; local_170 != local_30; local_170 = local_170 + 1) {
        bVar1 = Containers::BasicBitArrayView<const_char>::operator[]
                          ((BasicBitArrayView<const_char> *)&src_local,local_170);
        if (bVar1) {
          memcpy((void *)i,dstPtr,dstTypeSize);
          i = lVar9 + i;
        }
        dstPtr = dstPtr + lVar8;
      }
      return;
    }
    poVar5 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> *)
               ((long)&srcStride + 7));
    Error::Error(&local_140,poVar5,srcStride._7_1_);
    Debug::operator<<(&local_140.super_Debug,
                      "Utility::copyMasked(): second destination view dimension is not contiguous");
    Error::~Error(&local_140);
    abort();
  }
  poVar5 = Error::defaultOutput();
  Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_111);
  Error::Error(&local_110,poVar5,local_111);
  Debug::operator<<(&local_110.super_Debug,
                    "Utility::copyMasked(): second source view dimension is not contiguous");
  Error::~Error(&local_110);
  abort();
}

Assistant:

void copyMasked(const Containers::StridedArrayView2D<const char>& src, const Containers::BitArrayView srcMask, const Containers::StridedArrayView2D<char>& dst) {
    const std::size_t srcSize = src.size()[0];
    CORRADE_ASSERT(srcSize == srcMask.size(),
        "Utility::copyMasked(): expected source mask size to be" << srcSize << "but got" << srcMask.size(), );
    #ifndef CORRADE_NO_ASSERT
    const std::size_t srcMaskCount = srcMask.count();
    #endif
    CORRADE_ASSERT(srcMaskCount == dst.size()[0],
        "Utility::copyMasked(): expected" << srcMaskCount << "destination items but got" << dst.size()[0], );
    const std::size_t srcTypeSize = src.size()[1];
    #ifndef CORRADE_NO_ASSERT
    const std::size_t dstTypeSize = dst.size()[1];
    #endif
    CORRADE_ASSERT(srcTypeSize == dstTypeSize,
        "Utility::copyMasked(): expected second destination dimension size to be" << srcTypeSize << "but got" << dstTypeSize, );
    CORRADE_ASSERT(src.isContiguous<1>(),
        "Utility::copyMasked(): second source view dimension is not contiguous", );
    CORRADE_ASSERT(dst.isContiguous<1>(),
        "Utility::copyMasked(): second destination view dimension is not contiguous", );

    const std::ptrdiff_t srcStride = src.stride()[0];
    const std::ptrdiff_t dstStride = dst.stride()[0];
    const char* srcPtr = static_cast<const char*>(src.data());
    char* dstPtr = static_cast<char*>(dst.data());
    /** @todo instead of iterating over all src items it could iterate over all
        dst, and then at the end assert that there's no bits left (or that
        there's still bit positions), which could avoid the otherwise
        unnecessary popcount */
    for(std::size_t i = 0; i != srcSize; ++i) {
        /** @todo some better way to iterate set bits */
        if(srcMask[i]) {
            std::memcpy(dstPtr, srcPtr, srcTypeSize);
            dstPtr += dstStride;
        }

        srcPtr += srcStride;
    }
}